

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

bool __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::Create
          (Parse<SGParser::ParseStackGenericElement> *this,ParseTable *ptable,size_t stackSize)

{
  uint uVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t *psVar4;
  ParseStackGenericElement *pPVar5;
  size_t sVar6;
  long lVar7;
  
  uVar1 = this->TopState;
  if (uVar1 == 0xffffffff) {
    sVar6 = 0x80;
    if (0x80 < stackSize) {
      sVar6 = stackSize;
    }
    psVar4 = (size_t *)operator_new__(-(ulong)(stackSize >> 0x3a != 0) | sVar6 * 0x40 | 8);
    *psVar4 = sVar6;
    pPVar5 = (ParseStackGenericElement *)(psVar4 + 1);
    do {
      (pPVar5->super_ParseStackElement<SGParser::GenericToken>).State = 0xffffffff;
      (pPVar5->super_ParseStackElement<SGParser::GenericToken>).TerminalMarker = 0xffffffffffffffff;
      (pPVar5->Str)._M_dataplus._M_p = (pointer)&(pPVar5->Str).field_2;
      (pPVar5->Str)._M_string_length = 0;
      (pPVar5->Str).field_2._M_local_buf[0] = '\0';
      pPVar5->Line = 0;
      pPVar5->Offset = 0;
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 != (ParseStackGenericElement *)(psVar4 + sVar6 * 8 + 1));
    psVar2 = this->pValidTokenStackPositions;
    this->pValidTokenStackPositions = (size_t *)0x0;
    if (psVar2 != (size_t *)0x0) {
      operator_delete__(psVar2);
    }
    this->pParseTable = ptable;
    this->pTokenizer = (TokenStream<SGParser::GenericToken> *)0x0;
    this->TopState = 0xffffffff;
    this->ErrorMarker = 0xffffffffffffffff;
    pPVar5 = this->pStack;
    this->pStack = (ParseStackGenericElement *)(psVar4 + 1);
    if (pPVar5 != (ParseStackGenericElement *)0x0) {
      sVar3 = pPVar5[-1].Offset;
      if (sVar3 != 0) {
        lVar7 = sVar3 << 6;
        do {
          std::__cxx11::string::~string((string *)((long)pPVar5 + lVar7 + -0x30));
          lVar7 = lVar7 + -0x40;
        } while (lVar7 != 0);
      }
      operator_delete__(&pPVar5[-1].Offset,sVar3 << 6 | 8);
    }
    this->StackSize = sVar6;
    this->StackPosition = 0;
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool Parse<StackElement>::Create(const ParseTable* ptable, size_t stackSize) {
    // Make sure the parsing process is not started
    // IsValid() is reversed in this context: `this` is valid for Create
    // only if IsValid() is false
    if (IsValid())
        return false;

    // Allocate stack
    // Basic exception safety is provided
    const auto newStackSize = std::max(MinStackSize, stackSize);
    auto       newStack     = new StackElement[newStackSize];

    // From this point we can (safely) initialize the actual data

    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    pParseTable = ptable;
    pTokenizer  = nullptr;
    TopState    = InvalidState;
    ErrorMarker = InvalidIndex;

    // If new stack allocation is successful then modify the existing stack
    delete[] std::exchange(pStack, newStack);
    StackSize     = newStackSize;
    StackPosition = 0u;

    return true;
}